

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QKmsPlane>::moveAppend
          (QGenericArrayOps<QKmsPlane> *this,QKmsPlane *b,QKmsPlane *e)

{
  QKmsPlane *pQVar1;
  Data *pDVar2;
  uint *puVar3;
  qsizetype qVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  QKmsPlane *pQVar9;
  Type TVar10;
  Rotations RVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  uint32_t uVar15;
  uint32_t uVar16;
  uint32_t uVar17;
  qsizetype qVar18;
  
  if ((b != e) && (b < e)) {
    pQVar1 = (this->super_QArrayDataPointer<QKmsPlane>).ptr;
    qVar18 = (this->super_QArrayDataPointer<QKmsPlane>).size;
    do {
      pQVar1[qVar18].possibleCrtcs = b->possibleCrtcs;
      TVar10 = b->type;
      pQVar1[qVar18].id = b->id;
      pQVar1[qVar18].type = TVar10;
      pDVar2 = (b->supportedFormats).d.d;
      (b->supportedFormats).d.d = (Data *)0x0;
      pQVar1[qVar18].supportedFormats.d.d = pDVar2;
      puVar3 = (b->supportedFormats).d.ptr;
      (b->supportedFormats).d.ptr = (uint *)0x0;
      pQVar1[qVar18].supportedFormats.d.ptr = puVar3;
      qVar4 = (b->supportedFormats).d.size;
      (b->supportedFormats).d.size = 0;
      pQVar1[qVar18].supportedFormats.d.size = qVar4;
      RVar11.super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>.
      super_QFlagsStorage<QKmsPlane::Rotation>.i =
           (b->availableRotations).super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>;
      uVar5 = *(undefined8 *)&b->rotationPropertyId;
      uVar12 = b->framebufferPropertyId;
      uVar13 = b->srcXPropertyId;
      uVar6 = *(undefined8 *)&b->srcYPropertyId;
      uVar14 = b->crtcYPropertyId;
      uVar15 = b->srcwidthPropertyId;
      uVar7 = *(undefined8 *)&b->srcheightPropertyId;
      uVar16 = b->crtcheightPropertyId;
      uVar17 = b->zposPropertyId;
      uVar8 = *(undefined8 *)&b->blendOpPropertyId;
      pQVar9 = pQVar1 + qVar18;
      pQVar9->initialRotation =
           (QFlagsStorageHelper<QKmsPlane::Rotation,_4>)
           (b->initialRotation).super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>;
      pQVar9->availableRotations =
           (Rotations)
           RVar11.super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>.
           super_QFlagsStorage<QKmsPlane::Rotation>.i;
      *(undefined8 *)(&pQVar9->initialRotation + 2) = uVar5;
      pQVar9 = pQVar1 + qVar18;
      pQVar9->framebufferPropertyId = uVar12;
      pQVar9->srcXPropertyId = uVar13;
      *(undefined8 *)(&pQVar9->framebufferPropertyId + 2) = uVar6;
      pQVar9 = pQVar1 + qVar18;
      pQVar9->crtcYPropertyId = uVar14;
      pQVar9->srcwidthPropertyId = uVar15;
      *(undefined8 *)(&pQVar9->crtcYPropertyId + 2) = uVar7;
      pQVar9 = pQVar1 + qVar18;
      pQVar9->crtcheightPropertyId = uVar16;
      pQVar9->zposPropertyId = uVar17;
      *(undefined8 *)(&pQVar9->crtcheightPropertyId + 2) = uVar8;
      b = b + 1;
      qVar18 = (this->super_QArrayDataPointer<QKmsPlane>).size + 1;
      (this->super_QArrayDataPointer<QKmsPlane>).size = qVar18;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }